

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O0

void __thiscall trng::yarn4::backward(yarn4 *this)

{
  int iVar1;
  int32_t iVar2;
  int *in_RDI;
  int32_t in_stack_00000020;
  int32_t in_stack_00000024;
  result_type t;
  int local_c;
  
  if (in_RDI[3] == 0) {
    if (in_RDI[2] == 0) {
      if (in_RDI[1] == 0) {
        if (*in_RDI == 0) {
          local_c = 0;
        }
        else {
          iVar1 = in_RDI[7];
          iVar2 = int_math::modulo_inverse(in_stack_00000024,in_stack_00000020);
          local_c = (int)(((long)iVar1 * (long)iVar2) % 0x7fffffff);
        }
      }
      else {
        local_c = in_RDI[6] - (int)(((long)*in_RDI * (long)in_RDI[7]) % 0x7fffffff);
        if (local_c < 0) {
          local_c = local_c + 0x7fffffff;
        }
        iVar2 = int_math::modulo_inverse(in_stack_00000024,in_stack_00000020);
        local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffffff);
      }
    }
    else {
      local_c = in_RDI[5] - (int)(((long)*in_RDI * (long)in_RDI[6]) % 0x7fffffff);
      if (local_c < 0) {
        local_c = local_c + 0x7fffffff;
      }
      local_c = local_c - (int)(((long)in_RDI[1] * (long)in_RDI[7]) % 0x7fffffff);
      if (local_c < 0) {
        local_c = local_c + 0x7fffffff;
      }
      iVar2 = int_math::modulo_inverse(in_stack_00000024,in_stack_00000020);
      local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffffff);
    }
  }
  else {
    local_c = in_RDI[4] - (int)(((long)*in_RDI * (long)in_RDI[5]) % 0x7fffffff);
    if (local_c < 0) {
      local_c = local_c + 0x7fffffff;
    }
    local_c = local_c - (int)(((long)in_RDI[1] * (long)in_RDI[6]) % 0x7fffffff);
    if (local_c < 0) {
      local_c = local_c + 0x7fffffff;
    }
    local_c = local_c - (int)(((long)in_RDI[2] * (long)in_RDI[7]) % 0x7fffffff);
    if (local_c < 0) {
      local_c = local_c + 0x7fffffff;
    }
    iVar2 = int_math::modulo_inverse(in_stack_00000024,in_stack_00000020);
    local_c = (int)(((long)local_c * (long)iVar2) % 0x7fffffff);
  }
  in_RDI[4] = in_RDI[5];
  in_RDI[5] = in_RDI[6];
  in_RDI[6] = in_RDI[7];
  in_RDI[7] = local_c;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::backward() {
    result_type t;
    if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = t;
  }